

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_indexes.cpp
# Opt level: O1

void duckdb::DuckDBIndexesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  IndexCatalogEntry *this;
  pointer pcVar1;
  SchemaCatalogEntry *pSVar2;
  Catalog *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar3;
  optional_ptr<duckdb::TableCatalogEntry,_true> oVar4;
  element_type *peVar5;
  bool bVar6;
  reference pvVar7;
  string *psVar8;
  idx_t iVar9;
  long lVar10;
  _func_int **__n;
  string sql;
  ulong local_1b8;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_1a8;
  Value local_1a0;
  undefined1 *local_160 [2];
  undefined1 local_150 [48];
  GlobalTableFunctionState *local_120;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *local_118;
  ClientContext *local_110;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  LogicalType local_48;
  
  local_110 = context;
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  local_120 = (data_p->global_state).ptr;
  if (local_120[4]._vptr_GlobalTableFunctionState <
      (_func_int **)
      ((long)local_120[2]._vptr_GlobalTableFunctionState -
       (long)local_120[1]._vptr_GlobalTableFunctionState >> 3)) {
    __n = local_120[4]._vptr_GlobalTableFunctionState;
    if (__n < (_func_int **)
              ((long)local_120[2]._vptr_GlobalTableFunctionState -
               (long)local_120[1]._vptr_GlobalTableFunctionState >> 3)) {
      local_118 = (vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *)(local_120 + 1);
      local_1b8 = 0;
      do {
        local_120[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
        pvVar7 = vector<std::reference_wrapper<duckdb::CatalogEntry>,_true>::operator[]
                           (local_118,(size_type)__n);
        this = (IndexCatalogEntry *)pvVar7->_M_data;
        psVar8 = Catalog::GetName_abi_cxx11_
                           ((this->super_StandardEntry).super_InCatalogEntry.catalog);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        pcVar1 = (psVar8->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar1,pcVar1 + psVar8->_M_string_length);
        Value::Value((Value *)local_160,&local_88);
        DataChunk::SetValue(output,0,local_1b8,(Value *)local_160);
        Value::~Value((Value *)local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        iVar9 = Catalog::GetOid((this->super_StandardEntry).super_InCatalogEntry.catalog);
        lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar9);
        Value::BIGINT((Value *)local_160,lVar10);
        DataChunk::SetValue(output,1,local_1b8,(Value *)local_160);
        Value::~Value((Value *)local_160);
        pSVar2 = (this->super_StandardEntry).schema;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        pcVar1 = (pSVar2->super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar1,
                   pcVar1 + (pSVar2->super_InCatalogEntry).super_CatalogEntry.name._M_string_length)
        ;
        Value::Value((Value *)local_160,&local_a8);
        DataChunk::SetValue(output,2,local_1b8,(Value *)local_160);
        Value::~Value((Value *)local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                           ((((this->super_StandardEntry).schema)->super_InCatalogEntry).
                            super_CatalogEntry.oid);
        Value::BIGINT((Value *)local_160,lVar10);
        DataChunk::SetValue(output,3,local_1b8,(Value *)local_160);
        Value::~Value((Value *)local_160);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        pcVar1 = (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                 _M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,pcVar1,
                   pcVar1 + (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name
                            ._M_string_length);
        Value::Value((Value *)local_160,&local_c8);
        DataChunk::SetValue(output,4,local_1b8,(Value *)local_160);
        Value::~Value((Value *)local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                           ((this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.oid)
        ;
        Value::BIGINT((Value *)local_160,lVar10);
        DataChunk::SetValue(output,5,local_1b8,(Value *)local_160);
        Value::~Value((Value *)local_160);
        this_00 = (((this->super_StandardEntry).schema)->super_InCatalogEntry).catalog;
        (*(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
          [0x10])((Value *)local_160,this);
        (*(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
          [0x11])((string *)&local_1a0,this);
        local_1a8 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                              (this_00,local_110,(string *)local_160,(string *)&local_1a0,
                               THROW_EXCEPTION,(QueryErrorContext)0xffffffffffffffff);
        optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&local_1a8);
        oVar4.ptr = local_1a8.ptr;
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1a0.type_._0_8_ !=
            &local_1a0.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete((void *)local_1a0.type_._0_8_);
        }
        if (local_160[0] != local_150) {
          operator_delete(local_160[0]);
        }
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        pcVar1 = ((oVar4.ptr)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                 _M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,pcVar1,
                   pcVar1 + ((oVar4.ptr)->super_StandardEntry).super_InCatalogEntry.
                            super_CatalogEntry.name._M_string_length);
        Value::Value((Value *)local_160,&local_e8);
        DataChunk::SetValue(output,6,local_1b8,(Value *)local_160);
        Value::~Value((Value *)local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                           (((oVar4.ptr)->super_StandardEntry).super_InCatalogEntry.
                            super_CatalogEntry.oid);
        Value::BIGINT((Value *)local_160,lVar10);
        DataChunk::SetValue(output,7,local_1b8,(Value *)local_160);
        Value::~Value((Value *)local_160);
        Value::Value((Value *)local_160,
                     &(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.comment);
        DataChunk::SetValue(output,8,local_1b8,(Value *)local_160);
        Value::~Value((Value *)local_160);
        Value::MAP((Value *)local_160,
                   &(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.tags);
        DataChunk::SetValue(output,9,local_1b8,(Value *)local_160);
        Value::~Value((Value *)local_160);
        bVar6 = IndexCatalogEntry::IsUnique(this);
        Value::BOOLEAN((Value *)local_160,bVar6);
        DataChunk::SetValue(output,10,local_1b8,(Value *)local_160);
        Value::~Value((Value *)local_160);
        bVar6 = IndexCatalogEntry::IsPrimary(this);
        Value::BOOLEAN((Value *)local_160,bVar6);
        DataChunk::SetValue(output,0xb,local_1b8,(Value *)local_160);
        Value::~Value((Value *)local_160);
        GetIndexExpressions(&local_1a0,this);
        Value::ToString_abi_cxx11_(&local_68,&local_1a0);
        Value::Value((Value *)local_160,&local_68);
        DataChunk::SetValue(output,0xc,local_1b8,(Value *)local_160);
        Value::~Value((Value *)local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        Value::~Value(&local_1a0);
        (*(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[10]
        )(&local_1a0,this);
        peVar5 = local_1a0.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (local_1a0.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          LogicalType::LogicalType(&local_48,SQLNULL);
          Value::Value((Value *)local_160,&local_48);
        }
        else {
          ppaVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     **)&local_1a0.type_.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)local_1a0.type_._0_8_ == ppaVar3) {
            local_108.field_2._8_8_ = local_1a0._24_8_;
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          }
          else {
            local_108._M_dataplus._M_p = (pointer)local_1a0.type_._0_8_;
          }
          local_108.field_2._M_allocated_capacity._1_7_ =
               local_1a0.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._1_7_;
          local_108.field_2._M_local_buf[0] =
               local_1a0.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._0_1_;
          local_108._M_string_length =
               (size_type)
               local_1a0.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1a0.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_1a0.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_1_ = '\0';
          local_1a0.type_._0_8_ = ppaVar3;
          Value::Value((Value *)local_160,&local_108);
        }
        DataChunk::SetValue(output,0xd,local_1b8,(Value *)local_160);
        Value::~Value((Value *)local_160);
        if (peVar5 == (element_type *)0x0) {
          LogicalType::~LogicalType(&local_48);
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1a0.type_._0_8_ !=
            &local_1a0.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete((void *)local_1a0.type_._0_8_);
        }
        __n = local_120[4]._vptr_GlobalTableFunctionState;
        iVar9 = local_1b8 + 1;
      } while ((__n < (_func_int **)
                      ((long)local_120[2]._vptr_GlobalTableFunctionState -
                       (long)local_120[1]._vptr_GlobalTableFunctionState >> 3)) &&
              (bVar6 = local_1b8 < 0x7ff, local_1b8 = iVar9, bVar6));
    }
    else {
      iVar9 = 0;
    }
    output->count = iVar9;
  }
  return;
}

Assistant:

void DuckDBIndexesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBIndexesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++].get();

		auto &index = entry.Cast<IndexCatalogEntry>();
		// return values:

		idx_t col = 0;
		// database_name, VARCHAR
		output.SetValue(col++, count, index.catalog.GetName());
		// database_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(index.catalog.GetOid())));
		// schema_name, VARCHAR
		output.SetValue(col++, count, Value(index.schema.name));
		// schema_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(index.schema.oid)));
		// index_name, VARCHAR
		output.SetValue(col++, count, Value(index.name));
		// index_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(index.oid)));
		// find the table in the catalog
		auto &table_entry =
		    index.schema.catalog.GetEntry<TableCatalogEntry>(context, index.GetSchemaName(), index.GetTableName());
		// table_name, VARCHAR
		output.SetValue(col++, count, Value(table_entry.name));
		// table_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(table_entry.oid)));
		// comment, VARCHAR
		output.SetValue(col++, count, Value(index.comment));
		// tags, MAP
		output.SetValue(col++, count, Value::MAP(index.tags));
		// is_unique, BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(index.IsUnique()));
		// is_primary, BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(index.IsPrimary()));
		// expressions, VARCHAR
		output.SetValue(col++, count, GetIndexExpressions(index).ToString());
		// sql, VARCHAR
		auto sql = index.ToSQL();
		output.SetValue(col++, count, sql.empty() ? Value() : Value(std::move(sql)));

		count++;
	}
	output.SetCardinality(count);
}